

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int ptls_openssl_encrypt_ticket
              (ptls_buffer_t *buf,ptls_iovec_t src,
              _func_int_uchar_ptr_uchar_ptr_EVP_CIPHER_CTX_ptr_HMAC_CTX_ptr_int *cb)

{
  EVP_CIPHER_CTX *ctx;
  long lVar1;
  uchar *puVar2;
  code *in_RCX;
  int in_EDX;
  uchar *in_RSI;
  long *in_RDI;
  int ret;
  int clen;
  uint8_t *dst;
  HMAC_CTX *hctx;
  EVP_CIPHER_CTX *cctx;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar3;
  int in_stack_ffffffffffffffc4;
  ptls_buffer_t *in_stack_ffffffffffffffc8;
  HMAC_CTX *local_30;
  
  local_30 = (HMAC_CTX *)0x0;
  ctx = EVP_CIPHER_CTX_new();
  if (ctx == (EVP_CIPHER_CTX *)0x0) {
    iVar3 = 0x201;
  }
  else {
    local_30 = (HMAC_CTX *)HMAC_CTX_new();
    if (local_30 == (HMAC_CTX *)0x0) {
      iVar3 = 0x201;
    }
    else {
      iVar3 = ptls_buffer_reserve(in_stack_ffffffffffffffc8,
                                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      if (iVar3 == 0) {
        lVar1 = *in_RDI + in_RDI[2];
        iVar3 = (*in_RCX)(lVar1,lVar1 + 0x10,ctx,local_30,1);
        if (iVar3 == 0) {
          iVar3 = 0x203;
        }
        else {
          puVar2 = (uchar *)(lVar1 + 0x20);
          iVar3 = EVP_EncryptUpdate(ctx,puVar2,(int *)&stack0xffffffffffffffc4,in_RSI,in_EDX);
          if (iVar3 == 0) {
            iVar3 = 0x203;
          }
          else {
            puVar2 = puVar2 + in_stack_ffffffffffffffc4;
            iVar3 = EVP_EncryptFinal_ex(ctx,puVar2,(int *)&stack0xffffffffffffffc4);
            if (iVar3 == 0) {
              iVar3 = 0x203;
            }
            else {
              puVar2 = puVar2 + in_stack_ffffffffffffffc4;
              iVar3 = HMAC_Update(local_30,(uchar *)(*in_RDI + in_RDI[2]),
                                  (long)puVar2 - (*in_RDI + in_RDI[2]));
              if ((iVar3 == 0) || (iVar3 = HMAC_Final(local_30,puVar2,(uint *)0x0), iVar3 == 0)) {
                iVar3 = 0x203;
              }
              else {
                lVar1 = HMAC_size(local_30);
                if ((uchar *)(*in_RDI + in_RDI[1]) < puVar2 + lVar1) {
                  __assert_fail("dst <= buf->base + buf->capacity",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/openssl.c"
                                ,0x5bf,
                                "int ptls_openssl_encrypt_ticket(ptls_buffer_t *, ptls_iovec_t, int (*)(unsigned char *, unsigned char *, EVP_CIPHER_CTX *, HMAC_CTX *, int))"
                               );
                }
                in_RDI[2] = (long)(puVar2 + lVar1 + (in_RDI[2] - (*in_RDI + in_RDI[2])));
                iVar3 = 0;
              }
            }
          }
        }
      }
    }
  }
  if (ctx != (EVP_CIPHER_CTX *)0x0) {
    EVP_CIPHER_CTX_free(ctx);
  }
  if (local_30 != (HMAC_CTX *)0x0) {
    HMAC_CTX_free(local_30);
  }
  return iVar3;
}

Assistant:

int ptls_openssl_encrypt_ticket(ptls_buffer_t *buf, ptls_iovec_t src,
                                int (*cb)(unsigned char *key_name, unsigned char *iv, EVP_CIPHER_CTX *ctx, HMAC_CTX *hctx, int enc))
{
    EVP_CIPHER_CTX *cctx = NULL;
    HMAC_CTX *hctx = NULL;
    uint8_t *dst;
    int clen, ret;

    if ((cctx = EVP_CIPHER_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((hctx = HMAC_CTX_new()) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    if ((ret = ptls_buffer_reserve(buf, TICKET_LABEL_SIZE + TICKET_IV_SIZE + src.len + EVP_MAX_BLOCK_LENGTH + EVP_MAX_MD_SIZE)) !=
        0)
        goto Exit;
    dst = buf->base + buf->off;

    /* fill label and iv, as well as obtaining the keys */
    if (!(*cb)(dst, dst + TICKET_LABEL_SIZE, cctx, hctx, 1)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += TICKET_LABEL_SIZE + TICKET_IV_SIZE;

    /* encrypt */
    if (!EVP_EncryptUpdate(cctx, dst, &clen, src.base, (int)src.len)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += clen;
    if (!EVP_EncryptFinal_ex(cctx, dst, &clen)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += clen;

    /* append hmac */
    if (!HMAC_Update(hctx, buf->base + buf->off, dst - (buf->base + buf->off)) || !HMAC_Final(hctx, dst, NULL)) {
        ret = PTLS_ERROR_LIBRARY;
        goto Exit;
    }
    dst += HMAC_size(hctx);

    assert(dst <= buf->base + buf->capacity);
    buf->off += dst - (buf->base + buf->off);
    ret = 0;

Exit:
    if (cctx != NULL)
        EVP_CIPHER_CTX_free(cctx);
    if (hctx != NULL)
        HMAC_CTX_free(hctx);
    return ret;
}